

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INeuron.cpp
# Opt level: O0

void __thiscall INeuron::INeuron(INeuron *this,Potential _potential,Time _tRef,bool _isConsistent)

{
  bool _isConsistent_local;
  Time _tRef_local;
  Potential _potential_local;
  INeuron *this_local;
  
  this->_vptr_INeuron = (_func_int **)&PTR___cxa_pure_virtual_00143948;
  std::
  set<std::pair<float,_INeuron_*>,_std::less<std::pair<float,_INeuron_*>_>,_std::allocator<std::pair<float,_INeuron_*>_>_>
  ::set(&this->neighbours);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::unordered_set(&this->inputSynapses);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::unordered_set(&this->outputSynapses);
  this->potential = _potential;
  this->tRef = _tRef;
  this->consistent = _isConsistent;
  return;
}

Assistant:

INeuron::INeuron( SPIKING_NN::Potential _potential, SPIKING_NN::Time _tRef, bool _isConsistent ) :
        potential( _potential ), tRef( _tRef ), consistent( _isConsistent ) { }